

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_move_m68k(floatx80 a,float_status *status)

{
  flag zSign;
  floatx80 fVar1;
  ulong uVar2;
  uint zExp;
  floatx80 a_00;
  floatx80 fVar3;
  
  a_00.low = a.low;
  uVar2 = a._8_8_ & 0xffffffff;
  fVar3._8_8_ = uVar2;
  fVar3.low = a_00.low;
  fVar1._8_8_ = uVar2;
  fVar1.low = a_00.low;
  zExp = a._8_4_ & 0x7fff;
  zSign = (flag)((a._8_8_ & 0xffff) >> 0xf);
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (a_00.low == 0) {
      return fVar1;
    }
    normalizeRoundAndPackFloatx80_m68k
              (status->floatx80_rounding_precision,zSign,0,a_00.low,0,status);
  }
  else if (zExp == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      return fVar3;
    }
    a_00._8_8_ = uVar2;
    fVar3 = propagateFloatx80NaNOneArg(a_00,status);
    return fVar3;
  }
  fVar3 = roundAndPackFloatx80_m68k
                    (status->floatx80_rounding_precision,zSign,zExp,a_00.low,0,status);
  return fVar3;
}

Assistant:

floatx80 floatx80_move(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        return a;
    }
    if (aExp == 0) {
        if (aSig == 0) {
            return a;
        }
        normalizeRoundAndPackFloatx80(status->floatx80_rounding_precision,
                                      aSign, aExp, aSig, 0, status);
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision, aSign,
                                aExp, aSig, 0, status);
}